

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_quaddrawer.cpp
# Opt level: O1

void __thiscall FQuadDrawer::DoRender(FQuadDrawer *this,int type)

{
  FShader *pFVar1;
  float *pfVar2;
  long lVar3;
  float matV [16];
  float matT [16];
  float afStack_a4 [3];
  GLfloat local_98;
  float afStack_94 [14];
  undefined8 uStack_5c;
  float fStack_54;
  undefined8 auStack_50 [7];
  
  pfVar2 = &buffer[0].v;
  lVar3 = 0xc;
  do {
    *(float *)((long)afStack_a4 + lVar3) = ((FFlatVertex *)(pfVar2 + -4))->x;
    *(float *)((long)afStack_a4 + lVar3 + 4) = pfVar2[-3];
    *(float *)((long)afStack_a4 + lVar3 + 8) = pfVar2[-2];
    *(undefined4 *)((long)&local_98 + lVar3) = 0x3f800000;
    *(float *)((long)afStack_94 + lVar3 + 0x30) = pfVar2[-1];
    *(float *)((long)afStack_94 + lVar3 + 0x34) = *pfVar2;
    *(undefined8 *)((long)&uStack_5c + lVar3) = 0;
    pfVar2 = pfVar2 + 5;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x4c);
  pFVar1 = GLRenderer->mShaderManager->mActiveShader;
  afStack_a4[1] = 5.09304e-39;
  afStack_a4[2] = 0.0;
  (*_ptrc_glUniformMatrix4fv)(pFVar1->vertexmatrix_index,1,'\0',&local_98);
  afStack_a4[1] = 5.093071e-39;
  afStack_a4[2] = 0.0;
  (*_ptrc_glUniformMatrix4fv)(pFVar1->texcoordmatrix_index,1,'\0',(GLfloat *)((long)&uStack_5c + 4))
  ;
  afStack_a4[1] = 5.093102e-39;
  afStack_a4[2] = 0.0;
  (*_ptrc_glUniform1i)(pFVar1->quadmode_index,1);
  afStack_a4[1] = 5.093127e-39;
  afStack_a4[2] = 0.0;
  (*_ptrc_glDrawArrays)(type,0,4);
  afStack_a4[1] = 5.093144e-39;
  afStack_a4[2] = 0.0;
  (*_ptrc_glUniform1i)(pFVar1->quadmode_index,0);
  return;
}

Assistant:

void FQuadDrawer::DoRender(int type)
{
	// When this gets called, the render state must already be applied so we can just
	// send our vertices to the current shader.
	float matV[16], matT[16];
	
	for(int i=0;i<4;i++)
	{
		matV[i*4+0] = buffer[i].x;
		matV[i*4+1] = buffer[i].z;
		matV[i*4+2] = buffer[i].y;
		matV[i*4+3] = 1;
		matT[i*4+0] = buffer[i].u;
		matT[i*4+1] = buffer[i].v;
		matT[i*4+2] = matT[i*4+3] = 0;
	}
	FShader *shader = GLRenderer->mShaderManager->GetActiveShader();
	glUniformMatrix4fv(shader->vertexmatrix_index, 1, false, matV);
	glUniformMatrix4fv(shader->texcoordmatrix_index, 1, false, matT);
	glUniform1i(shader->quadmode_index, 1);
	GLRenderer->mVBO->RenderArray(type, FFlatVertexBuffer::QUAD_INDEX, 4);
	glUniform1i(shader->quadmode_index, 0);
}